

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.hpp
# Opt level: O1

void __thiscall Threading::SpinLock::unlock(SpinLock *this)

{
  string msg;
  string local_28;
  
  if (((this->m_IsLocked)._M_base._M_i & 1U) == 0) {
    Diligent::FormatString<char[100]>
              (&local_28,
               (char (*) [100])
               "Attempting to unlock a spin lock that is not locked. This is a strong indication of a flawed logic."
              );
    Diligent::DebugAssertionFailed
              (local_28._M_dataplus._M_p,"unlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/SpinLock.hpp"
               ,0x50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  (this->m_IsLocked)._M_base._M_i = false;
  return;
}

Assistant:

void unlock() noexcept
    {
        VERIFY(is_locked(), "Attempting to unlock a spin lock that is not locked. This is a strong indication of a flawed logic.");
        m_IsLocked.store(false, std::memory_order_release);
    }